

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ringbuf.c
# Opt level: O0

uint16_t adt_rbfh_nextLen(uint16_t wanted)

{
  byte local_d;
  uint8_t i;
  uint16_t wanted_local;
  
  local_d = 0;
  while( true ) {
    if (7 < local_d) {
      return 0xffff;
    }
    if (wanted <= adt_rbfh_nextLen::accepted[local_d]) break;
    local_d = local_d + 1;
  }
  return adt_rbfh_nextLen::accepted[local_d];
}

Assistant:

DYN_STATIC uint16_t adt_rbfh_nextLen(uint16_t wanted)
{
   static const uint16_t accepted[RBFH_NUM_ACCEPTED_LENGTHS] = {10u, 50u, 100u, 500u, 1000u, 5000u, 10000u, 50000u};
   uint8_t i;
   for(i=0u; i<RBFH_NUM_ACCEPTED_LENGTHS; i++)
   {
      if (accepted[i] >= wanted)
      {
         return accepted[i];
      }
   }
   return USHRT_MAX;
}